

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O1

shared_ptr<AvlTree<Worker>::Node> __thiscall
AvlTree<Worker>::_leftRotate(AvlTree<Worker> *this,shared_ptr<AvlTree<Worker>::Node> *node)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  int iVar7;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  element_type *extraout_RDX;
  element_type *extraout_RDX_00;
  element_type *extraout_RDX_01;
  shared_ptr<AvlTree<Worker>::Node> sVar9;
  shared_ptr<AvlTree<Worker>::Node> T2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  lVar1 = *in_RDX;
  (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(lVar1 + 0x38);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x40);
  (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  peVar3 = (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar4 = (peVar3->left).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_20._M_pi =
       (peVar3->left).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  peVar3 = (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (peVar3->left).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar3->left).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RDX + 1));
  lVar1 = *in_RDX;
  *(element_type **)(lVar1 + 0x38) = peVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0x40),&local_20);
  lVar1 = *(long *)(*in_RDX + 0x28);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x30);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (lVar1 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *(int *)(lVar1 + 0x48);
  }
  lVar1 = *(long *)(*in_RDX + 0x38);
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x40);
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  if (lVar1 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = *(int *)(lVar1 + 0x48);
  }
  if (iVar7 < iVar6) {
    iVar7 = iVar6;
  }
  *(int *)(*in_RDX + 0x48) = iVar7 + 1;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  lVar1 = *(long *)(*in_RDX + 0x28);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x30);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (lVar1 == 0) {
    iVar6 = 1;
  }
  else {
    iVar6 = *(int *)(lVar1 + 0x4c) + 1;
  }
  lVar1 = *(long *)(*in_RDX + 0x38);
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x40);
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  if (lVar1 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = *(int *)(lVar1 + 0x4c);
  }
  *(int *)(*in_RDX + 0x4c) = iVar6 + iVar7;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar3 = (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar4 = (peVar3->left).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (peVar3->left).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (peVar4 == (element_type *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = peVar4->height;
  }
  peVar3 = (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar4 = (peVar3->right).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (peVar3->right).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  if (peVar4 == (element_type *)0x0) {
    iVar7 = 0;
  }
  else {
    iVar7 = peVar4->height;
  }
  if (iVar7 < iVar6) {
    iVar7 = iVar6;
  }
  peVar3 = (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar3->height = iVar7 + 1;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar4 = (peVar3->left).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (peVar3->left).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (peVar4 == (element_type *)0x0) {
    iVar6 = 1;
  }
  else {
    iVar6 = peVar4->size + 1;
  }
  _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  peVar3 = (((element_type *)_Var8._M_pi)->right).
           super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (((element_type *)_Var8._M_pi)->right).
           super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  if (peVar3 == (element_type *)0x0) {
    iVar7 = 0;
  }
  else {
    iVar7 = peVar3->size;
  }
  ((this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  size = iVar6 + iVar7;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
  }
  sVar9.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar9.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<AvlTree<Worker>::Node>)
         sVar9.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> _leftRotate(std::shared_ptr<Node>& node)
    {
        auto y = node->right;
        auto T2 = y->left;

        // Perform rotation
        y->left = node;
        node->right = T2;

        // Update node values
        node->height = std::max(_height(node->left), _height(node->right)) + 1;
        node->size = _size(node->left) + _size(node->right) + 1;

        y->height = std::max(_height(y->left), _height(y->right)) + 1;
        y->size = _size(y->left) + _size(y->right) + 1;

        // Return new root
        return y;
    }